

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testIndicesAndLocations(FunctionalTest14_15 *this)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  bVar4 = true;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if ((bVar4) &&
       (this->m_subroutine_indices[lVar3][0] == this->m_initial_subroutine_indices[lVar3][0])) {
      bVar4 = this->m_subroutine_indices[lVar3][1] == this->m_initial_subroutine_indices[lVar3][1];
    }
    else {
      bVar4 = false;
    }
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if (bVar4 == false) {
      bVar4 = false;
    }
    else {
      bVar4 = this->m_subroutine_uniform_locations[lVar3] ==
              this->m_initial_subroutine_uniform_locations[lVar3];
    }
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  return bVar4;
}

Assistant:

bool FunctionalTest14_15::testIndicesAndLocations() const
{
	static const GLuint n_subroutine_types = 2;
	bool				result			   = true;

	/* Verify subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		result = result && (m_subroutine_indices[type][0] == m_initial_subroutine_indices[type][0]);
		result = result && (m_subroutine_indices[type][1] == m_initial_subroutine_indices[type][1]);
	}

	/* Verify subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_types; ++uniform)
	{
		result = result && (m_subroutine_uniform_locations[uniform] == m_initial_subroutine_uniform_locations[uniform]);
	}

	return result;
}